

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::tuple_caster<std::tuple,double,double,double>::
       cast_impl<std::tuple<double,double,double>,0ul,1ul,2ul>(undefined8 *src)

{
  undefined8 uVar1;
  long lVar2;
  handle hVar3;
  tuple result;
  array<pybind11::object,_3UL> entries;
  handle local_38;
  object local_30 [3];
  
  local_30[0].super_handle.m_ptr = (handle)PyFloat_FromDouble(src[2]);
  local_30[1].super_handle.m_ptr = (handle)PyFloat_FromDouble(src[1]);
  local_30[2].super_handle.m_ptr = (handle)PyFloat_FromDouble(*src);
  hVar3.m_ptr = (PyObject *)0x0;
  lVar2 = 0;
  do {
    if (*(long *)((long)&local_30[0].super_handle.m_ptr + lVar2) == 0) goto LAB_001983fb;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  tuple::tuple((tuple *)&local_38,3);
  hVar3.m_ptr = local_38.m_ptr;
  lVar2 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&local_30[0].super_handle.m_ptr + lVar2);
    *(undefined8 *)((long)&local_30[0].super_handle.m_ptr + lVar2) = 0;
    if (((local_38.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                    ,0x588,
                    "static handle pybind11::detail::tuple_caster<std::tuple, double, double, double>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <double, double, double>, T = std::tuple<double, double, double>, Is = <0UL, 1UL, 2UL>]"
                   );
    }
    *(undefined8 *)((long)&local_38.m_ptr[1].ob_type + lVar2) = uVar1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  local_38.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_38);
LAB_001983fb:
  lVar2 = 0x10;
  do {
    object::~object((object *)((long)&local_30[0].super_handle.m_ptr + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }